

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS
ref_interp_face_only
          (REF_INTERP ref_interp,REF_INT faceid,REF_INT leading_dim,REF_DBL *from_scalar,
          REF_DBL *to_scalar)

{
  REF_CELL pRVar1;
  REF_GRID ref_grid;
  REF_MPI pRVar2;
  REF_NODE ref_node;
  REF_INT *proc;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  REF_DBL *pRVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  size_t __size;
  ulong uVar16;
  long lVar17;
  int iVar18;
  REF_INT RVar19;
  double dVar20;
  uint local_148;
  REF_INT n_donor;
  REF_INT *local_140;
  REF_MPI local_138;
  REF_GLOB *l2c;
  void *local_128;
  void *local_120;
  REF_INT *recept_node;
  REF_INT *donor_ret;
  REF_BOOL increase_fuzz;
  void *local_100;
  REF_INT *local_f8;
  REF_DBL *local_f0;
  REF_INT *donor_node;
  REF_DBL *donor_bary;
  REF_DBL *recept_scalar;
  REF_CELL local_d0;
  REF_DBL *local_c8;
  REF_INT *donor_cell;
  REF_LONG ncell;
  REF_GLOB nnode;
  REF_INT nodes [27];
  
  pRVar1 = ref_interp->from_tet;
  ref_grid = ref_interp->to_grid;
  pRVar2 = ref_grid->mpi;
  ref_node = ref_grid->node;
  local_f0 = to_scalar;
  uVar3 = ref_grid_compact_surf_id_nodes(ref_grid,faceid,&nnode,&ncell,&l2c);
  if (uVar3 != 0) {
    uVar16 = (ulong)uVar3;
    pcVar15 = "l2c";
    uVar11 = 0x8a0;
    goto LAB_0015f1aa;
  }
  for (lVar8 = 0; lVar8 < ref_node->max; lVar8 = lVar8 + 1) {
    if ((-1 < ref_node->global[lVar8]) &&
       ((l2c[lVar8] == -1 || (ref_node->ref_mpi->id != ref_node->part[lVar8])))) {
      ref_interp->cell[lVar8] = -0x39;
    }
  }
  increase_fuzz = 0;
  iVar18 = 0xd;
  local_138 = pRVar2;
  local_d0 = pRVar1;
  local_c8 = from_scalar;
  do {
    iVar18 = iVar18 + -1;
    if (iVar18 == 0) {
      if (increase_fuzz != 0) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x8b5,"ref_interp_face_only","unable to grow fuzz to find tree candidate",0,
               (long)increase_fuzz);
        return 1;
      }
      break;
    }
    if ((increase_fuzz != 0) &&
       (ref_interp->search_fuzz = ref_interp->search_fuzz * 10.0, local_138->id == 0)) {
      printf("retry tree search with %e fuzz\n");
    }
    uVar3 = ref_interp_tree(ref_interp,&increase_fuzz);
    if (uVar3 != 0) {
      uVar16 = (ulong)uVar3;
      pcVar15 = "tree";
      uVar11 = 0x8b0;
      goto LAB_0015f1aa;
    }
    if ((ref_interp->instrument != 0) &&
       (uVar3 = ref_mpi_stopwatch_stop(local_138,"tree"), uVar3 != 0)) {
      uVar16 = (ulong)uVar3;
      pcVar15 = "locate clock";
      uVar11 = 0x8b2;
      goto LAB_0015f1aa;
    }
  } while (increase_fuzz != 0);
  lVar8 = 0;
  while( true ) {
    iVar18 = ref_node->max;
    if (iVar18 <= lVar8) break;
    if ((-1 < ref_node->global[lVar8]) &&
       ((l2c[lVar8] == -1 || (ref_node->ref_mpi->id != ref_node->part[lVar8])))) {
      ref_interp->cell[lVar8] = -1;
    }
    lVar8 = lVar8 + 1;
  }
  uVar3 = 0;
  for (lVar8 = 0; lVar8 < iVar18; lVar8 = lVar8 + 1) {
    if (((-1 < ref_node->global[lVar8]) && (l2c[lVar8] != -1)) &&
       (ref_node->ref_mpi->id == ref_node->part[lVar8])) {
      uVar3 = uVar3 + 1;
      local_148 = uVar3;
    }
  }
  if ((int)uVar3 < 0) {
    pcVar15 = "malloc recept_bary of REF_DBL negative";
    uVar11 = 0x8c4;
LAB_0015f52f:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar11
           ,"ref_interp_face_only",pcVar15);
    return 1;
  }
  pvVar5 = malloc((ulong)(uVar3 * 4) << 3);
  if (pvVar5 == (void *)0x0) {
    pcVar15 = "malloc recept_bary of REF_DBL NULL";
    uVar11 = 0x8c4;
  }
  else {
    __size = (ulong)uVar3 << 2;
    pvVar6 = malloc(__size);
    if (pvVar6 == (void *)0x0) {
      pcVar15 = "malloc recept_cell of REF_INT NULL";
      uVar11 = 0x8c5;
    }
    else {
      local_140 = (REF_INT *)malloc(__size);
      recept_node = local_140;
      if (local_140 == (REF_INT *)0x0) {
        pcVar15 = "malloc recept_node of REF_INT NULL";
        uVar11 = 0x8c6;
      }
      else {
        pvVar7 = malloc(__size);
        if (pvVar7 == (void *)0x0) {
          pcVar15 = "malloc recept_ret of REF_INT NULL";
          uVar11 = 0x8c7;
        }
        else {
          local_120 = pvVar7;
          local_f8 = (REF_INT *)malloc(__size);
          if (local_f8 != (REF_INT *)0x0) {
            local_148 = 0;
            lVar8 = 0;
            uVar3 = 0;
            local_128 = pvVar6;
            local_100 = pvVar5;
            for (lVar17 = 0; lVar17 < iVar18; lVar17 = lVar17 + 1) {
              if (((-1 < ref_node->global[lVar17]) && (l2c[lVar17] != -1)) &&
                 (ref_node->ref_mpi->id == ref_node->part[lVar17])) {
                if (ref_interp->cell[lVar17] == -1) {
                  pcVar15 = "node needs to be localized";
                  uVar11 = 0x8cd;
                  goto LAB_0015f52f;
                }
                uVar4 = ref_node_clip_bary4((REF_DBL *)((long)ref_interp->bary + lVar8),
                                            (REF_DBL *)
                                            ((long)local_100 + (long)(int)(uVar3 * 4) * 8));
                if (uVar4 != 0) {
                  uVar16 = (ulong)uVar4;
                  pcVar15 = "clip";
                  uVar11 = 0x8d0;
                  goto LAB_0015f1aa;
                }
                lVar9 = (long)(int)uVar3;
                local_f8[lVar9] = ref_interp->part[lVar17];
                *(REF_INT *)((long)local_128 + lVar9 * 4) = ref_interp->cell[lVar17];
                local_140[lVar9] = (REF_INT)lVar17;
                *(REF_INT *)((long)local_120 + lVar9 * 4) = local_138->id;
                uVar3 = uVar3 + 1;
                iVar18 = ref_node->max;
                local_148 = uVar3;
              }
              lVar8 = lVar8 + 0x20;
            }
            free(l2c);
            proc = local_f8;
            pRVar2 = local_138;
            uVar4 = ref_mpi_blindsend(local_138,local_f8,local_128,1,uVar3,&donor_cell,&n_donor,1);
            if (uVar4 == 0) {
              uVar4 = ref_mpi_blindsend(pRVar2,proc,local_120,1,uVar3,&donor_ret,&n_donor,1);
              if (uVar4 == 0) {
                uVar3 = ref_mpi_blindsend(pRVar2,proc,local_140,1,uVar3,&donor_node,&n_donor,1);
                pvVar5 = local_100;
                if (uVar3 == 0) {
                  uVar3 = ref_mpi_blindsend(pRVar2,proc,local_100,4,local_148,&donor_bary,&n_donor,3
                                           );
                  if (uVar3 == 0) {
                    free(proc);
                    free(local_120);
                    free(recept_node);
                    free(local_128);
                    free(pvVar5);
                    RVar19 = n_donor;
                    if (n_donor * leading_dim < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x8ee,"ref_interp_face_only","malloc donor_scalar of REF_DBL negative"
                            );
                      return 1;
                    }
                    local_140 = (REF_INT *)malloc((ulong)(uint)(n_donor * leading_dim) << 3);
                    if (local_140 == (REF_INT *)0x0) {
                      pcVar15 = "malloc donor_scalar of REF_DBL NULL";
                      uVar11 = 0x8ee;
                      local_140 = (REF_INT *)0x0;
                      goto LAB_0015f664;
                    }
                    lVar8 = 0;
                    uVar16 = 0;
                    if (0 < leading_dim) {
                      uVar16 = (ulong)(uint)leading_dim;
                    }
                    lVar17 = (long)leading_dim;
                    for (; lVar8 < RVar19; lVar8 = lVar8 + 1) {
                      uVar3 = ref_cell_nodes(local_d0,donor_cell[lVar8],nodes);
                      if (uVar3 != 0) {
                        uVar16 = (ulong)uVar3;
                        pcVar15 = "node needs to be localized";
                        uVar11 = 0x8f2;
                        goto LAB_0015f1aa;
                      }
                      for (uVar12 = 0; uVar12 != uVar16; uVar12 = uVar12 + 1) {
                        (local_140 + lVar8 * lVar17 * 2 + uVar12 * 2)[0] = 0;
                        (local_140 + lVar8 * lVar17 * 2 + uVar12 * 2)[1] = 0;
                        dVar20 = 0.0;
                        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
                          dVar20 = dVar20 + donor_bary
                                            [(ulong)((uint)lVar8 & 0x3fffffff) * 4 + lVar9] *
                                            local_c8[uVar12 + nodes[lVar9] * lVar17];
                          *(double *)(local_140 + lVar8 * lVar17 * 2 + uVar12 * 2) = dVar20;
                        }
                      }
                      RVar19 = n_donor;
                    }
                    free(donor_cell);
                    free(donor_bary);
                    uVar3 = ref_mpi_blindsend(local_138,donor_ret,local_140,leading_dim,n_donor,
                                              &recept_scalar,(REF_INT *)&local_148,3);
                    if (uVar3 == 0) {
                      uVar3 = ref_mpi_blindsend(local_138,donor_ret,donor_node,1,n_donor,
                                                &recept_node,(REF_INT *)&local_148,1);
                      if (uVar3 == 0) {
                        free(local_140);
                        free(donor_node);
                        free(donor_ret);
                        uVar13 = 0;
                        pRVar10 = recept_scalar;
                        uVar12 = (ulong)local_148;
                        if ((int)local_148 < 1) {
                          uVar12 = uVar13;
                        }
                        for (; uVar13 != uVar12; uVar13 = uVar13 + 1) {
                          iVar18 = recept_node[uVar13];
                          for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
                            local_f0[(long)(iVar18 * leading_dim) + uVar14] = pRVar10[uVar14];
                          }
                          pRVar10 = pRVar10 + lVar17;
                        }
                        free(recept_node);
                        free(recept_scalar);
                        uVar3 = ref_node_ghost_dbl(ref_node,local_f0,leading_dim);
                        if (uVar3 == 0) {
                          return 0;
                        }
                        uVar16 = (ulong)uVar3;
                        pcVar15 = "ghost";
                        uVar11 = 0x915;
                      }
                      else {
                        uVar16 = (ulong)uVar3;
                        pcVar15 = "blind send node";
                        uVar11 = 0x905;
                      }
                    }
                    else {
                      uVar16 = (ulong)uVar3;
                      pcVar15 = "blind send bary";
                      uVar11 = 0x902;
                    }
                    goto LAB_0015f1aa;
                  }
                  pcVar15 = "blind send bary";
                  uVar11 = 0x8e6;
                }
                else {
                  pcVar15 = "blind send node";
                  uVar11 = 0x8e3;
                }
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,uVar11,"ref_interp_face_only",(ulong)uVar3,pcVar15);
                return uVar3;
              }
              uVar16 = (ulong)uVar4;
              pcVar15 = "blind send ret";
              uVar11 = 0x8e0;
            }
            else {
              uVar16 = (ulong)uVar4;
              pcVar15 = "blind send cell";
              uVar11 = 0x8dd;
            }
LAB_0015f1aa:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,uVar11,"ref_interp_face_only",uVar16,pcVar15);
            return (REF_STATUS)uVar16;
          }
          pcVar15 = "malloc recept_proc of REF_INT NULL";
          uVar11 = 0x8c8;
        }
      }
    }
  }
LAB_0015f664:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar11,
         "ref_interp_face_only",pcVar15);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_interp_face_only(REF_INTERP ref_interp, REF_INT faceid,
                                        REF_INT leading_dim,
                                        REF_DBL *from_scalar,
                                        REF_DBL *to_scalar) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_MPI ref_mpi = ref_grid_mpi(to_grid);
  REF_CELL from_cell = ref_interp_from_tet(ref_interp);
  REF_INT node, ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT receptor, n_recept, donation, n_donor;
  REF_DBL *recept_scalar, *donor_scalar, *recept_bary, *donor_bary;
  REF_INT *donor_node, *donor_ret, *donor_cell;
  REF_INT *recept_proc, *recept_ret, *recept_node, *recept_cell;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;
  REF_BOOL increase_fuzz;
  REF_INT tries;

  RSS(ref_grid_compact_surf_id_nodes(to_grid, faceid, &nnode, &ncell, &l2c),
      "l2c");

  each_ref_node_valid_node(to_node, node) {
    if (REF_EMPTY == l2c[node] || !ref_node_owned(to_node, node)) {
      ref_interp->cell[node] = -57; /* magic number to skip */
    }
  }

  increase_fuzz = REF_FALSE;
  for (tries = 0; tries < 12; tries++) {
    if (increase_fuzz) {
      ref_interp_search_fuzz(ref_interp) *= 10.0;
      if (ref_mpi_once(ref_mpi))
        printf("retry tree search with %e fuzz\n",
               ref_interp_search_fuzz(ref_interp));
    }
    RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
    if (ref_interp->instrument)
      RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");
    if (!increase_fuzz) break;
  }
  REIS(REF_FALSE, increase_fuzz, "unable to grow fuzz to find tree candidate");

  each_ref_node_valid_node(to_node, node) {
    if (REF_EMPTY == l2c[node] || !ref_node_owned(to_node, node)) {
      ref_interp->cell[node] = REF_EMPTY; /* set back */
    }
  }

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (REF_EMPTY != l2c[node] && ref_node_owned(to_node, node)) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_node, n_recept, REF_INT);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_proc, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (REF_EMPTY != l2c[node] && ref_node_owned(to_node, node)) {
      RUS(REF_EMPTY, ref_interp->cell[node], "node needs to be localized");
      RSS(ref_node_clip_bary4(&(ref_interp->bary[4 * node]),
                              &(recept_bary[4 * n_recept])),
          "clip");
      recept_proc[n_recept] = ref_interp->part[node];
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_node[n_recept] = node;
      recept_ret[n_recept] = ref_mpi_rank(ref_mpi);
      n_recept++;
    }
  }

  ref_free(l2c);

  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_node, 1, n_recept,
                        (void **)(&donor_node), &n_donor, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_free(recept_proc);
  ref_free(recept_ret);
  ref_free(recept_node);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_malloc(donor_scalar, leading_dim * n_donor, REF_DBL);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (im = 0; im < leading_dim; im++) {
      donor_scalar[im + leading_dim * donation] = 0.0;
      for (ibary = 0; ibary < 4; ibary++) {
        donor_scalar[im + leading_dim * donation] +=
            donor_bary[ibary + 4 * donation] *
            from_scalar[im + leading_dim * nodes[ibary]];
      }
    }
  }
  ref_free(donor_cell);
  ref_free(donor_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_scalar, leading_dim,
                        n_donor, (void **)(&recept_scalar), &n_recept,
                        REF_DBL_TYPE),
      "blind send bary");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_node, 1, n_donor,
                        (void **)(&recept_node), &n_recept, REF_INT_TYPE),
      "blind send node");
  ref_free(donor_scalar);
  ref_free(donor_node);
  ref_free(donor_ret);

  for (receptor = 0; receptor < n_recept; receptor++) {
    node = recept_node[receptor];
    for (im = 0; im < leading_dim; im++) {
      to_scalar[im + leading_dim * node] =
          recept_scalar[im + leading_dim * receptor];
    }
  }

  ref_free(recept_node);
  ref_free(recept_scalar);

  RSS(ref_node_ghost_dbl(to_node, to_scalar, leading_dim), "ghost");

  return REF_SUCCESS;
}